

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void ui_key(int key,int down)

{
  ImGuiIO *this;
  bool bVar1;
  
  this = ImGui::GetIO();
  if (key < 0) {
    __assert_fail("key >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                  ,0x42,"void ui_key(int, int)");
  }
  if ((uint)key < 0x200) {
    this->KeysDown[(uint)key] = down != 0;
    bVar1 = this->KeysDown[0x87];
    if (this->KeysDown[0x82] != false) {
      bVar1 = true;
    }
    this->KeyCtrl = bVar1;
    bVar1 = this->KeysDown[0x8a];
    if (this->KeysDown[0x85] != false) {
      bVar1 = true;
    }
    this->KeyShift = bVar1;
    bVar1 = this->KeysDown[0x86];
    if (this->KeysDown[0x81] != false) {
      bVar1 = true;
    }
    this->KeyAlt = bVar1;
    bVar1 = this->KeysDown[0x89];
    if (this->KeysDown[0x84] != false) {
      bVar1 = true;
    }
    this->KeySuper = bVar1;
    if (key - 0x20U < 0x60 && down != 0) {
      ImGuiIO::AddInputCharacter(this,key);
      return;
    }
    return;
  }
  __assert_fail("key < sizeof(io.KeysDown)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/w23[P]stameska/src/ui.cpp"
                ,0x43,"void ui_key(int, int)");
}

Assistant:

void ui_key(int key /*AKey*/, int down) {
	ImGuiIO& io = ImGui::GetIO();
	IM_ASSERT(key >= 0);
	IM_ASSERT(key < sizeof(io.KeysDown));
	io.KeysDown[key] = !!down;

	io.KeyCtrl = io.KeysDown[AK_LeftCtrl] || io.KeysDown[AK_RightCtrl];
	io.KeyShift = io.KeysDown[AK_LeftShift] || io.KeysDown[AK_RightShift];
	io.KeyAlt = io.KeysDown[AK_LeftAlt] || io.KeysDown[AK_RightAlt];
	io.KeySuper = io.KeysDown[AK_LeftSuper] || io.KeysDown[AK_RightSuper];

	if (down && key >= 32 && key < 128)
		io.AddInputCharacter(key);
}